

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  parasail_result_t *ppVar7;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  __m128i_64_t B_1;
  long lVar25;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint uVar34;
  int iVar35;
  int iVar42;
  int iVar43;
  __m128i_64_t A_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i_64_t A;
  int64_t iVar55;
  __m128i_64_t B_2;
  undefined1 auVar56 [16];
  __m128i_64_t B_5;
  undefined1 auVar57 [16];
  __m128i_64_t B_4;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar74;
  int iVar75;
  int iVar77;
  undefined1 auVar72 [16];
  int iVar76;
  undefined1 auVar73 [16];
  undefined1 local_1b8 [16];
  long lStack_190;
  long local_178;
  long local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_138 [16];
  undefined1 local_108 [16];
  undefined8 local_f8;
  long local_f0;
  int *local_e8;
  long local_e0;
  long local_d8;
  ulong local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  long local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  int64_t iVar8;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse2_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse2_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar42 = matrix->min;
  iVar18 = -open;
  uVar10 = 0x8000000000000000 - (long)iVar42;
  if (iVar42 != iVar18 && SBORROW4(iVar42,iVar18) == iVar42 + open < 0) {
    uVar10 = (ulong)(uint)open | 0x8000000000000000;
  }
  lVar9 = uVar10 + 1;
  lVar13 = 0x7ffffffffffffffe - (long)matrix->max;
  auVar32._8_4_ = (int)lVar9;
  auVar32._0_8_ = lVar9;
  auVar32._12_4_ = (int)((ulong)lVar9 >> 0x20);
  lVar19 = (long)_s1Len;
  local_d8 = lVar19 + -1;
  uVar20 = (ulong)(uint)s2Len;
  local_c8 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_c8._4_4_ = 0;
    local_c8._0_4_ = gap * 2;
    local_c8._8_4_ = gap * 2;
    local_c8._12_4_ = 0;
  }
  lStack_190 = auVar32._8_8_;
  local_88._8_8_ = lStack_190;
  local_88._0_8_ = lVar9;
  local_98._8_8_ = lStack_190;
  local_98._0_8_ = lVar9;
  local_a8._8_8_ = lStack_190;
  local_a8._0_8_ = lVar9;
  local_108._8_8_ = lStack_190;
  local_108._0_8_ = lVar9;
  local_b8._8_8_ = lStack_190;
  local_b8._0_8_ = lVar9;
  if (s1_beg == 0) {
    local_158._8_8_ = (long)iVar18;
    local_158._0_8_ = (long)(iVar18 - gap);
  }
  ppVar7 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar7 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar7->flag | 0x2821002;
  uVar11 = (ulong)(s2Len + 2);
  local_f8 = uVar10;
  ptr = parasail_memalign_int64_t(0x10,uVar11);
  ptr_00 = parasail_memalign_int64_t(0x10,uVar11);
  ptr_01 = parasail_memalign_int64_t(0x10,uVar11);
  if (ptr_01 == (int64_t *)0x0 || (ptr_00 == (int64_t *)0x0 || ptr == (int64_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
    if (ptr_02 == (int64_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      lVar16 = 0;
      do {
        ptr_02[lVar16] = (long)piVar1[(byte)_s1[lVar16]];
        lVar16 = lVar16 + 1;
      } while (lVar19 != lVar16);
    }
    ptr_02[lVar19] = 0;
  }
  else {
    ptr_02 = (int64_t *)0x0;
  }
  local_78 = lVar13;
  uStack_70 = 0;
  uVar34 = (uint)lVar13;
  iVar42 = (int)((ulong)lVar13 >> 0x20);
  local_138._8_4_ = uVar34;
  local_138._0_8_ = lVar13;
  local_138._12_4_ = iVar42;
  local_48 = open;
  uStack_44 = 0;
  iStack_40 = open;
  uStack_3c = 0;
  local_58._0_8_ = CONCAT44(0,gap);
  local_58._8_4_ = gap;
  local_58._12_4_ = 0;
  auVar4 = local_58;
  piVar1 = matrix->mapper;
  uVar10 = 0;
  do {
    ptr[uVar10 + 1] = (long)piVar1[(byte)_s2[uVar10]];
    uVar10 = uVar10 + 1;
  } while (uVar20 != uVar10);
  *ptr = 0;
  ptr[uVar20 + 1] = 0;
  lVar13 = (long)iVar18;
  if (s2_beg == 0) {
    uVar10 = 0;
    lVar16 = lVar13;
    do {
      ptr_00[uVar10 + 1] = lVar16;
      ptr_01[uVar10 + 1] = lVar9;
      uVar10 = uVar10 + 1;
      lVar16 = lVar16 - (ulong)(uint)gap;
    } while (uVar20 != uVar10);
  }
  else {
    uVar10 = 0;
    do {
      ptr_00[uVar10 + 1] = 0;
      ptr_01[uVar10 + 1] = lVar9;
      uVar10 = uVar10 + 1;
    } while (uVar20 != uVar10);
  }
  *ptr_01 = lVar9;
  ptr_00[uVar20 + 1] = lVar9;
  ptr_01[uVar20 + 1] = lVar9;
  *ptr_00 = 0;
  local_b8 = auVar32;
  local_98 = auVar32;
  local_108 = auVar32;
  local_88 = auVar32;
  local_a8 = auVar32;
  local_168 = auVar32;
  if (0 < _s1Len) {
    local_e0 = lVar13;
    local_e8 = matrix->matrix;
    local_68 = auVar32 >> 0x40;
    local_f0 = uVar20 * 8;
    local_170 = uVar20 * 4 + -4;
    local_1b8 = ZEXT416(1);
    local_178 = 0;
    uVar10 = 0;
    do {
      if (matrix->type == 0) {
        uVar11 = ptr_02[uVar10];
        iVar8 = ptr_02[uVar10 + 1];
      }
      else {
        uVar6 = (uint)uVar10 | 1;
        if (lVar19 <= (long)(uVar10 | 1)) {
          uVar6 = _s1Len - 1;
        }
        iVar8 = (int64_t)(int)uVar6;
        uVar11 = uVar10;
      }
      iVar15 = matrix->size;
      local_d0 = uVar10 + 2;
      iVar55 = *ptr_00;
      *ptr_00 = lVar13 - local_d0 * (uint)gap;
      iVar71 = iVar18 - (uint)uVar10 * gap;
      if (s1_beg != 0) {
        iVar71 = 0;
      }
      auVar66._8_8_ = (long)iVar71;
      auVar66._0_8_ = lStack_190;
      uVar12 = 0;
      auVar57 = ZEXT816(0xffffffffffffffff);
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar44 = auVar32;
      auVar36 = auVar32;
      auVar22 = _DAT_00904920;
      lVar16 = lStack_190;
      do {
        auVar26._0_8_ = local_e8[iVar8 * iVar15 + ptr[uVar12]] + lVar16;
        auVar26._8_8_ = local_e8[uVar11 * (long)iVar15 + ptr[uVar12 + 1]] + iVar55;
        lVar16 = auVar66._8_8_;
        iVar55 = ptr_00[uVar12 + 1];
        auVar50._0_8_ = lVar16 - (ulong)(uint)open;
        auVar50._8_8_ = iVar55 - (ulong)(uint)open;
        local_58._12_4_ = 0;
        auVar46._0_8_ = auVar36._8_8_ - local_58._0_8_;
        auVar46._8_8_ = ptr_01[uVar12 + 1] - local_58._8_8_;
        auVar56._0_8_ = auVar66._0_8_ - (ulong)(uint)open;
        auVar56._8_8_ = lVar16 - (ulong)(uint)open;
        auVar36._0_8_ = auVar44._0_8_ - local_58._0_8_;
        auVar36._8_8_ = auVar44._8_8_ - local_58._8_8_;
        auVar44 = auVar46 ^ auVar22;
        auVar66 = auVar50 ^ auVar22;
        iVar71 = -(uint)(auVar44._0_4_ < auVar66._0_4_);
        iVar74 = -(uint)(auVar44._4_4_ < auVar66._4_4_);
        iVar75 = -(uint)(auVar44._8_4_ < auVar66._8_4_);
        iVar77 = -(uint)(auVar44._12_4_ < auVar66._12_4_);
        auVar58._4_4_ = iVar71;
        auVar58._0_4_ = iVar71;
        auVar58._8_4_ = iVar75;
        auVar58._12_4_ = iVar75;
        auVar67._4_4_ = -(uint)(auVar66._4_4_ == auVar44._4_4_);
        auVar67._12_4_ = -(uint)(auVar66._12_4_ == auVar44._12_4_);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar45._4_4_ = iVar74;
        auVar45._0_4_ = iVar74;
        auVar45._8_4_ = iVar77;
        auVar45._12_4_ = iVar77;
        auVar45 = auVar45 | auVar67 & auVar58;
        auVar46 = ~auVar45 & auVar46 | auVar50 & auVar45;
        auVar44 = auVar36 ^ auVar22;
        auVar66 = auVar56 ^ auVar22;
        iVar71 = -(uint)(auVar44._0_4_ < auVar66._0_4_);
        iVar75 = -(uint)(auVar44._4_4_ < auVar66._4_4_);
        iVar74 = -(uint)(auVar44._8_4_ < auVar66._8_4_);
        iVar77 = -(uint)(auVar44._12_4_ < auVar66._12_4_);
        auVar68._4_4_ = iVar71;
        auVar68._0_4_ = iVar71;
        auVar68._8_4_ = iVar74;
        auVar68._12_4_ = iVar74;
        iVar71 = -(uint)(auVar66._4_4_ == auVar44._4_4_);
        iVar74 = -(uint)(auVar66._12_4_ == auVar44._12_4_);
        auVar52._4_4_ = iVar71;
        auVar52._0_4_ = iVar71;
        auVar52._8_4_ = iVar74;
        auVar52._12_4_ = iVar74;
        auVar51._4_4_ = iVar75;
        auVar51._0_4_ = iVar75;
        auVar51._8_4_ = iVar77;
        auVar51._12_4_ = iVar77;
        auVar51 = auVar51 | auVar52 & auVar68;
        auVar52 = ~auVar51 & auVar36 | auVar56 & auVar51;
        auVar44 = auVar52 ^ auVar22;
        auVar36 = auVar26 ^ auVar22;
        iVar71 = -(uint)(auVar44._0_4_ < auVar36._0_4_);
        iVar75 = -(uint)(auVar44._4_4_ < auVar36._4_4_);
        iVar74 = -(uint)(auVar44._8_4_ < auVar36._8_4_);
        iVar77 = -(uint)(auVar44._12_4_ < auVar36._12_4_);
        auVar59._4_4_ = iVar71;
        auVar59._0_4_ = iVar71;
        auVar59._8_4_ = iVar74;
        auVar59._12_4_ = iVar74;
        iVar71 = -(uint)(auVar36._4_4_ == auVar44._4_4_);
        iVar74 = -(uint)(auVar36._12_4_ == auVar44._12_4_);
        auVar44._4_4_ = iVar71;
        auVar44._0_4_ = iVar71;
        auVar44._8_4_ = iVar74;
        auVar44._12_4_ = iVar74;
        auVar37._4_4_ = iVar75;
        auVar37._0_4_ = iVar75;
        auVar37._8_4_ = iVar77;
        auVar37._12_4_ = iVar77;
        auVar37 = auVar37 | auVar44 & auVar59;
        auVar66 = ~auVar37 & auVar52 | auVar26 & auVar37;
        auVar44 = auVar66 ^ auVar22;
        auVar36 = auVar46 ^ auVar22;
        iVar71 = -(uint)(auVar36._0_4_ < auVar44._0_4_);
        iVar75 = -(uint)(auVar36._4_4_ < auVar44._4_4_);
        iVar74 = -(uint)(auVar36._8_4_ < auVar44._8_4_);
        iVar77 = -(uint)(auVar36._12_4_ < auVar44._12_4_);
        auVar60._4_4_ = iVar71;
        auVar60._0_4_ = iVar71;
        auVar60._8_4_ = iVar74;
        auVar60._12_4_ = iVar74;
        iVar71 = -(uint)(auVar36._4_4_ == auVar44._4_4_);
        iVar74 = -(uint)(auVar36._12_4_ == auVar44._12_4_);
        auVar30._4_4_ = iVar71;
        auVar30._0_4_ = iVar71;
        auVar30._8_4_ = iVar74;
        auVar30._12_4_ = iVar74;
        auVar27._4_4_ = iVar75;
        auVar27._0_4_ = iVar75;
        auVar27._8_4_ = iVar77;
        auVar27._12_4_ = iVar77;
        auVar27 = auVar27 | auVar30 & auVar60;
        auVar54._0_4_ = -(uint)(auVar57._0_4_ == auVar63._0_4_);
        iVar71 = auVar57._4_4_;
        lVar25 = auVar57._8_8_;
        auVar54._4_4_ = -(uint)(iVar71 == auVar63._4_4_);
        iVar74 = auVar57._12_4_;
        auVar54._8_4_ = -(uint)(auVar57._8_4_ == auVar63._8_4_);
        auVar54._12_4_ = -(uint)(iVar74 == auVar63._12_4_);
        auVar69._4_4_ = auVar54._0_4_;
        auVar69._0_4_ = auVar54._4_4_;
        auVar69._8_4_ = auVar54._12_4_;
        auVar69._12_4_ = auVar54._8_4_;
        auVar69 = auVar69 & auVar54;
        auVar66 = local_158 & auVar69 | ~auVar69 & (~auVar27 & auVar46 | auVar66 & auVar27);
        auVar44 = auVar66 ^ auVar22;
        iVar75 = auVar44._0_4_;
        iVar77 = auVar44._4_4_;
        iVar76 = auVar44._8_4_;
        iVar33 = auVar44._12_4_;
        if (1 < uVar12) {
          auVar44 = local_138 ^ auVar22;
          iVar35 = -(uint)(auVar44._0_4_ < iVar75);
          auVar38._4_4_ = -(uint)(auVar44._4_4_ < iVar77);
          iVar43 = -(uint)(auVar44._8_4_ < iVar76);
          auVar38._12_4_ = -(uint)(auVar44._12_4_ < iVar33);
          auVar61._4_4_ = iVar35;
          auVar61._0_4_ = iVar35;
          auVar61._8_4_ = iVar43;
          auVar61._12_4_ = iVar43;
          auVar21._4_4_ = -(uint)(auVar44._4_4_ == iVar77);
          auVar21._12_4_ = -(uint)(auVar44._12_4_ == iVar33);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar38 = auVar38 | auVar21 & auVar61;
          local_138 = local_138 & auVar38 | ~auVar38 & auVar66;
          auVar22 = local_168 ^ auVar22;
          iVar35 = -(uint)(iVar75 < auVar22._0_4_);
          auVar39._4_4_ = -(uint)(iVar77 < auVar22._4_4_);
          iVar43 = -(uint)(iVar76 < auVar22._8_4_);
          auVar39._12_4_ = -(uint)(iVar33 < auVar22._12_4_);
          auVar62._4_4_ = iVar35;
          auVar62._0_4_ = iVar35;
          auVar62._8_4_ = iVar43;
          auVar62._12_4_ = iVar43;
          auVar23._4_4_ = -(uint)(auVar22._4_4_ == iVar77);
          auVar23._12_4_ = -(uint)(auVar22._12_4_ == iVar33);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          auVar39 = auVar39 | auVar23 & auVar62;
          local_168 = local_168 & auVar39 | ~auVar39 & auVar66;
        }
        piVar1 = ((ppVar7->field_4).rowcols)->score_row;
        if (uVar12 < uVar20) {
          *(int *)((long)piVar1 + uVar12 * 4 + local_178) = auVar66._8_4_;
        }
        auVar36 = ~auVar69 & auVar46 | auVar32 & auVar69;
        if (uVar12 != 0 && (long)(uVar10 | 1) < lVar19) {
          *(int *)((long)piVar1 + uVar12 * 4 + local_170) = auVar66._0_4_;
        }
        auVar22 = _DAT_00904920;
        auVar44 = auVar32 & auVar69 | ~auVar69 & auVar52;
        lVar14 = auVar57._0_8_;
        auVar47._8_8_ = -(ulong)(lVar25 == uVar20 - 1);
        auVar47._0_8_ = -(ulong)(lVar14 == uVar20 - 1);
        auVar53._8_8_ = -(ulong)(lVar25 < (long)uVar20);
        auVar53._0_8_ = -(ulong)(lVar14 < (long)uVar20);
        auVar63 = local_88 ^ _DAT_00904920;
        iVar35 = -(uint)(auVar63._0_4_ < iVar75);
        auVar70._4_4_ = -(uint)(auVar63._4_4_ < iVar77);
        iVar43 = -(uint)(auVar63._8_4_ < iVar76);
        auVar70._12_4_ = -(uint)(auVar63._12_4_ < iVar33);
        auVar72._4_4_ = iVar35;
        auVar72._0_4_ = iVar35;
        auVar72._8_4_ = iVar43;
        auVar72._12_4_ = iVar43;
        auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar77);
        auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar33);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        auVar70._0_4_ = auVar70._4_4_;
        auVar70._8_4_ = auVar70._12_4_;
        auVar63 = local_98 ^ _DAT_00904920;
        iVar75 = -(uint)(auVar63._0_4_ < iVar75);
        auVar73._4_4_ = -(uint)(auVar63._4_4_ < iVar77);
        iVar76 = -(uint)(auVar63._8_4_ < iVar76);
        auVar73._12_4_ = -(uint)(auVar63._12_4_ < iVar33);
        auVar65._4_4_ = -(uint)(auVar63._4_4_ == iVar77);
        auVar65._12_4_ = -(uint)(auVar63._12_4_ == iVar33);
        auVar28._4_4_ = iVar75;
        auVar28._0_4_ = iVar75;
        auVar28._8_4_ = iVar76;
        auVar28._12_4_ = iVar76;
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar73._0_4_ = auVar73._4_4_;
        auVar73._8_4_ = auVar73._12_4_;
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar29._0_4_ = -(uint)(-1 < iVar71);
        auVar29._4_4_ = -(uint)(-1 < iVar71);
        auVar29._8_4_ = -(uint)(-1 < iVar74);
        auVar29._12_4_ = -(uint)(-1 < iVar74);
        auVar2._8_8_ = -(ulong)(local_1b8._8_8_ == local_d8);
        auVar2._0_8_ = -(ulong)(local_1b8._0_8_ == local_d8);
        auVar30 = auVar29 & auVar53 & auVar2 & (auVar70 | auVar64 & auVar72);
        auVar3._8_8_ = -(ulong)((long)local_1b8._8_8_ < lVar19);
        auVar3._0_8_ = -(ulong)((long)local_1b8._0_8_ < lVar19);
        auVar54 = auVar3 & auVar47 & (auVar73 | auVar65 & auVar28);
        local_88 = auVar30 & auVar66 | ~auVar30 & local_88;
        local_98 = auVar54 & auVar66 | ~auVar54 & local_98;
        local_a8 = ~(auVar47 & auVar2) & local_a8 | auVar66 & auVar47 & auVar2;
        local_108 = auVar54 & local_1b8 | ~auVar54 & local_108;
        local_b8 = auVar30 & auVar57 | ~auVar30 & local_b8;
        ptr_00[uVar12] = auVar66._0_8_;
        ptr_01[uVar12] = auVar36._0_8_;
        auVar57._0_8_ = lVar14 + 1;
        auVar57._8_8_ = lVar25 - auVar63._8_8_;
        uVar12 = uVar12 + 1;
      } while (s2Len + 1 != uVar12);
      local_1b8._8_8_ = local_1b8._8_8_ + 2;
      local_1b8._0_8_ = local_1b8._0_8_ + 2;
      local_158._8_8_ = local_158._8_8_ - local_c8._8_8_;
      local_158._0_8_ = local_158._0_8_ - local_c8._0_8_;
      local_178 = local_178 + local_f0;
      local_170 = local_170 + local_f0;
      uVar10 = local_d0;
    } while ((long)local_d0 < lVar19);
  }
  lVar16 = 0;
  uVar10 = 0;
  iVar18 = 0;
  lVar19 = lVar9;
  lVar13 = lVar9;
  bVar5 = true;
  do {
    bVar17 = bVar5;
    lVar25 = *(long *)(local_98 + lVar16);
    if (lVar9 < lVar25) {
      uVar20 = *(ulong *)(local_108 + lVar16);
LAB_005b6154:
      uVar10 = uVar20 & 0xffffffff;
      lVar9 = lVar25;
    }
    else if ((lVar25 == lVar9) &&
            (uVar20 = *(ulong *)(local_108 + lVar16), (long)uVar20 < (long)(int)uVar10))
    goto LAB_005b6154;
    iVar15 = (int)uVar10;
    if (lVar19 < *(long *)(local_88 + lVar16)) {
      iVar18 = *(int *)(local_b8 + lVar16);
      lVar19 = *(long *)(local_88 + lVar16);
    }
    if (lVar13 < *(long *)(local_a8 + lVar16)) {
      lVar13 = *(long *)(local_a8 + lVar16);
    }
    lVar16 = lVar16 + 8;
    bVar5 = false;
  } while (bVar17);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar15 = _s1Len + -1;
      iVar71 = s2Len + -1;
      if (s2_end != 0) {
        lVar13 = lVar19;
        iVar71 = iVar18;
      }
      goto LAB_005b624f;
    }
  }
  else if (lVar9 <= lVar19) {
    if ((lVar9 != lVar19) || (lVar13 = lVar9, iVar71 = s2Len + -1, iVar18 != s2Len + -1)) {
      iVar15 = _s1Len + -1;
      lVar13 = lVar19;
      iVar71 = iVar18;
    }
    goto LAB_005b624f;
  }
  lVar13 = lVar9;
  iVar71 = s2Len + -1;
LAB_005b624f:
  iVar18 = (int)lVar13;
  iVar74 = -(uint)((int)((uint)local_f8 ^ 0x80000000) < (int)(local_138._0_4_ ^ 0x80000000));
  auVar40._4_4_ = -(uint)(local_f8._4_4_ < (int)local_138._4_4_);
  iVar75 = -(uint)((int)((uint)local_f8 ^ 0x80000000) < (int)(local_138._8_4_ ^ 0x80000000));
  auVar40._12_4_ = -(uint)(local_f8._4_4_ < (int)local_138._12_4_);
  auVar48._4_4_ = iVar74;
  auVar48._0_4_ = iVar74;
  auVar48._8_4_ = iVar75;
  auVar48._12_4_ = iVar75;
  auVar22._4_4_ = -(uint)(local_f8._4_4_ == local_138._4_4_);
  auVar22._12_4_ = -(uint)(local_f8._4_4_ == local_138._12_4_);
  auVar22._0_4_ = auVar22._4_4_;
  auVar22._8_4_ = auVar22._12_4_;
  auVar40._0_4_ = auVar40._4_4_;
  auVar40._8_4_ = auVar40._12_4_;
  auVar24._8_4_ = 0xffffffff;
  auVar24._0_8_ = 0xffffffffffffffff;
  auVar24._12_4_ = 0xffffffff;
  iVar74 = -(uint)((int)(uVar34 ^ 0x80000000) < (int)(local_168._0_4_ ^ 0x80000000));
  auVar31._4_4_ = -(uint)(iVar42 < (int)local_168._4_4_);
  iVar75 = -(uint)((int)(uVar34 ^ 0x80000000) < (int)(local_168._8_4_ ^ 0x80000000));
  auVar31._12_4_ = -(uint)(iVar42 < (int)local_168._12_4_);
  auVar49._4_4_ = iVar74;
  auVar49._0_4_ = iVar74;
  auVar49._8_4_ = iVar75;
  auVar49._12_4_ = iVar75;
  auVar41._4_4_ = -(uint)(iVar42 == local_168._4_4_);
  auVar41._12_4_ = -(uint)(iVar42 == local_168._12_4_);
  auVar41._0_4_ = auVar41._4_4_;
  auVar41._8_4_ = auVar41._12_4_;
  auVar31._0_4_ = auVar31._4_4_;
  auVar31._8_4_ = auVar31._12_4_;
  auVar32 = auVar31 | auVar41 & auVar49 | auVar24 ^ (auVar40 | auVar22 & auVar48);
  if ((((((((((((((((auVar32 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar32 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar32 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar32 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar32 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar32 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar32 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar32 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar32[0xf] < '\0') {
    *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
    iVar18 = 0;
    iVar71 = 0;
    iVar15 = 0;
  }
  ppVar7->score = iVar18;
  ppVar7->end_query = iVar15;
  ppVar7->end_ref = iVar71;
  local_58 = auVar4;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar7;
  }
  return ppVar7;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64_rpl(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_row = NEG_LIMIT;
        int64_t max_col = NEG_LIMIT;
        int64_t last_val = NEG_LIMIT;
        int64_t *s = (int64_t*)&vMaxHRow;
        int64_t *t = (int64_t*)&vMaxHCol;
        int64_t *u = (int64_t*)&vLastVal;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}